

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O0

void __thiscall RVO::RVOSimulator::~RVOSimulator(RVOSimulator *this)

{
  pointer ppAVar1;
  Obstacle *this_00;
  size_type sVar2;
  reference ppAVar3;
  size_type sVar4;
  reference ppOVar5;
  vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *in_RDI;
  size_t i_1;
  size_t i;
  Agent *in_stack_ffffffffffffff90;
  Agent *in_stack_ffffffffffffffa0;
  size_type local_28;
  ulong local_20;
  
  ppAVar1 = in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar1 != (pointer)0x0) {
    Agent::~Agent(in_stack_ffffffffffffff90);
    operator_delete(ppAVar1);
  }
  ppAVar1 = in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppAVar1 != (pointer)0x0) {
    KdTree::~KdTree((KdTree *)in_stack_ffffffffffffff90);
    operator_delete(ppAVar1);
  }
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(in_RDI);
    if (sVar2 <= local_20) break;
    ppAVar3 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[](in_RDI,local_20);
    in_stack_ffffffffffffffa0 = *ppAVar3;
    if (in_stack_ffffffffffffffa0 != (Agent *)0x0) {
      Agent::~Agent(in_stack_ffffffffffffff90);
      operator_delete(in_stack_ffffffffffffffa0);
    }
    local_20 = local_20 + 1;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = local_28;
    sVar4 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::size
                      ((vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)(in_RDI + 1));
    if (sVar4 <= sVar2) break;
    ppOVar5 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::operator[]
                        ((vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)(in_RDI + 1),
                         local_28);
    this_00 = *ppOVar5;
    if (this_00 != (Obstacle *)0x0) {
      Obstacle::~Obstacle(this_00);
      operator_delete(this_00);
    }
    local_28 = local_28 + 1;
  }
  std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::~vector
            ((vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> *)in_stack_ffffffffffffffa0)
  ;
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::~vector
            ((vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

RVOSimulator::~RVOSimulator() {
  delete defaultAgent_;
  delete kdTree_;

  for (std::size_t i = 0U; i < agents_.size(); ++i) {
    delete agents_[i];
  }

  for (std::size_t i = 0U; i < obstacles_.size(); ++i) {
    delete obstacles_[i];
  }
}